

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_handler.c
# Opt level: O0

void ngx_stream_finalize_session(ngx_stream_session_t *s,ngx_uint_t rc)

{
  ngx_uint_t rc_local;
  ngx_stream_session_t *s_local;
  
  if ((s->connection->log->log_level & 0x400) != 0) {
    ngx_log_error_core(8,s->connection->log,0,"finalize stream session: %i",rc);
  }
  s->status = rc;
  ngx_stream_log_session(s);
  ngx_stream_close_connection(s->connection);
  return;
}

Assistant:

void
ngx_stream_finalize_session(ngx_stream_session_t *s, ngx_uint_t rc)
{
    ngx_log_debug1(NGX_LOG_DEBUG_STREAM, s->connection->log, 0,
                   "finalize stream session: %i", rc);

    s->status = rc;

    ngx_stream_log_session(s);

    ngx_stream_close_connection(s->connection);
}